

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O1

void __thiscall OpenMD::DumpReader::parseDumpLine(DumpReader *this,string *line)

{
  bool bVar1;
  uint i;
  int iVar2;
  uint index;
  RigidBody *this_00;
  long lVar3;
  long lVar4;
  RigidBody *rb;
  ulong uVar5;
  double tmp;
  RealType RVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Quat4d q;
  string type;
  StringTokenizer tokenizer;
  RealType local_138;
  RealType local_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  RigidBody *local_100;
  string local_f8;
  undefined1 local_d8 [32];
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  StringTokenizer local_88;
  
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_88,line,(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_88);
  if (iVar2 < 2) {
    snprintf(painCave.errMsg,2000,"DumpReader Error: Not enough Tokens.\n%s\n",
             (line->_M_dataplus)._M_p);
    painCave.isFatal = 1;
    simError();
  }
  index = StringTokenizer::nextTokenAsInt(&local_88);
  this_00 = (RigidBody *)SimInfo::getIOIndexToIntegrableObject(this->info_,index);
  if (this_00 != (RigidBody *)0x0) {
    StringTokenizer::nextToken_abi_cxx11_(&local_f8,&local_88);
    if ((this->needPos_ == true) &&
       (lVar3 = std::__cxx11::string::find((char *)&local_f8,0x2a4632,0), lVar3 == -1)) {
      snprintf(painCave.errMsg,2000,
               "DumpReader Error: StuntDouble %d has no Position\n\tField (\"p\") specified.\n%s\n",
               (ulong)index,(line->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    if ((((this_00->super_StuntDouble).objType_ - otDAtom < 2) && (this->needQuaternion_ == true))
       && (lVar3 = std::__cxx11::string::find((char *)&local_f8,0x29bc7f,0), lVar3 == -1)) {
      snprintf(painCave.errMsg,2000,
               "DumpReader Error: Directional StuntDouble %d has no\n\tQuaternion Field (\"q\") specified.\n%s\n"
               ,(ulong)index,(line->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    if (0 < (int)(uint)local_f8._M_string_length) {
      uVar5 = 0;
      local_100 = this_00;
      do {
        switch(local_f8._M_dataplus._M_p[uVar5]) {
        case 'c':
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          if ((this_00->super_StuntDouble).objType_ < otRigidBody) {
            lVar3 = __dynamic_cast(this_00,&StuntDouble::typeinfo,&Atom::typeinfo,0);
            bVar1 = AtomType::isFluctuatingCharge(*(AtomType **)(lVar3 + 0x78));
            if (bVar1) {
              lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
              lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                        currentSnapshot_->atomData).flucQPos.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                               (this_00->super_StuntDouble).storage_);
              goto LAB_0013ba0a;
            }
          }
          break;
        case 'd':
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
          lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).density.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                           (this_00->super_StuntDouble).storage_);
          goto LAB_0013ba0a;
        case 'e':
          local_138 = StringTokenizer::nextTokenAsDouble(&local_88);
          local_130 = StringTokenizer::nextTokenAsDouble(&local_88);
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          if (this->readField_ == true) {
            lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).electricField.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            goto LAB_0013b9c8;
          }
          break;
        case 'f':
          local_138 = StringTokenizer::nextTokenAsDouble(&local_88);
          local_130 = StringTokenizer::nextTokenAsDouble(&local_88);
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
          lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).force.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (this_00->super_StuntDouble).storage_);
          goto LAB_0013b9c8;
        case 'g':
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          if ((this_00->super_StuntDouble).objType_ < otRigidBody) {
            lVar3 = __dynamic_cast(this_00,&StuntDouble::typeinfo,&Atom::typeinfo,0);
            bVar1 = AtomType::isFluctuatingCharge(*(AtomType **)(lVar3 + 0x78));
            if (bVar1) {
              lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
              lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                        currentSnapshot_->atomData).flucQFrc.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                               (this_00->super_StuntDouble).storage_);
              goto LAB_0013ba0a;
            }
          }
          break;
        default:
          snprintf(painCave.errMsg,2000,"DumpReader Error: %s is an unrecognized type\n");
          this_00 = local_100;
          painCave.isFatal = 1;
          simError();
          break;
        case 'j':
          if ((this_00->super_StuntDouble).objType_ - otDAtom < 2) {
            local_138 = StringTokenizer::nextTokenAsDouble(&local_88);
            local_130 = StringTokenizer::nextTokenAsDouble(&local_88);
            RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
            if (this->needAngMom_ == true) {
              lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
              lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                        currentSnapshot_->atomData).angularMomentum.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                               (this_00->super_StuntDouble).storage_);
              goto LAB_0013b9c8;
            }
          }
          break;
        case 'p':
          local_138 = StringTokenizer::nextTokenAsDouble(&local_88);
          local_130 = StringTokenizer::nextTokenAsDouble(&local_88);
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          if (this->needPos_ == true) {
            lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).position.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            goto LAB_0013b9c8;
          }
          break;
        case 'q':
          local_118 = 0.0;
          dStack_110 = 0.0;
          local_128 = 0.0;
          dStack_120 = 0.0;
          if ((this_00->super_StuntDouble).objType_ - otDAtom < 2) {
            local_128 = StringTokenizer::nextTokenAsDouble(&local_88);
            dStack_120 = StringTokenizer::nextTokenAsDouble(&local_88);
            local_118 = StringTokenizer::nextTokenAsDouble(&local_88);
            dStack_110 = StringTokenizer::nextTokenAsDouble(&local_88);
            dVar7 = 0.0;
            lVar3 = 0;
            do {
              dVar7 = dVar7 + (&local_128)[lVar3] * (&local_128)[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            if (dVar7 < 1e-06) {
              memcpy(&painCave,
                     "DumpReader Error: initial quaternion error (q0^2 + q1^2 + q2^2 + q3^2) ~ 0\n",
                     0x4c);
              this_00 = local_100;
              painCave.isFatal = 1;
              simError();
            }
            dVar7 = 0.0;
            lVar3 = 0;
            do {
              dVar7 = dVar7 + (&local_128)[lVar3] * (&local_128)[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            lVar3 = 0;
            do {
              auVar8._8_8_ = dVar7;
              auVar8._0_8_ = dVar7;
              auVar8 = divpd(*(undefined1 (*) [16])(&local_128 + lVar3),auVar8);
              *(undefined1 (*) [16])(&local_128 + lVar3) = auVar8;
              lVar3 = lVar3 + 2;
            } while (lVar3 != 4);
            if (this->needQuaternion_ == true) {
              local_a8 = 0.0;
              dStack_a0 = 0.0;
              local_b8 = 0.0;
              dStack_b0 = 0.0;
              local_d8._16_8_ = 0;
              local_d8._24_8_ = 0;
              local_d8._0_8_ = (pointer)0x0;
              local_d8._8_8_ = 0.0;
              local_98 = 0.0;
              SquareMatrix3<double>::setupRotMat
                        ((SquareMatrix3<double> *)local_d8,local_128,dStack_120,local_118,dStack_110
                        );
              (*(this_00->super_StuntDouble)._vptr_StuntDouble[3])(this_00,local_d8);
            }
          }
          break;
        case 's':
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
          lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).sitePotential.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                           (this_00->super_StuntDouble).storage_);
          goto LAB_0013ba0a;
        case 't':
          local_138 = StringTokenizer::nextTokenAsDouble(&local_88);
          local_130 = StringTokenizer::nextTokenAsDouble(&local_88);
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
          lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).torque.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (this_00->super_StuntDouble).storage_);
LAB_0013b9c8:
          *(RealType *)(lVar3 + lVar4 * 0x18) = local_138;
          *(RealType *)(lVar3 + 8 + lVar4 * 0x18) = local_130;
          *(RealType *)(lVar3 + 0x10 + lVar4 * 0x18) = RVar6;
          break;
        case 'u':
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
          lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).particlePot.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                           (this_00->super_StuntDouble).storage_);
LAB_0013ba0a:
          *(RealType *)(lVar3 + lVar4 * 8) = RVar6;
          break;
        case 'v':
          local_138 = StringTokenizer::nextTokenAsDouble(&local_88);
          local_130 = StringTokenizer::nextTokenAsDouble(&local_88);
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          if (this->needVel_ == true) {
            lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).velocity.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            goto LAB_0013b9c8;
          }
          break;
        case 'w':
          RVar6 = StringTokenizer::nextTokenAsDouble(&local_88);
          if ((this_00->super_StuntDouble).objType_ < otRigidBody) {
            lVar3 = __dynamic_cast(this_00,&StuntDouble::typeinfo,&Atom::typeinfo,0);
            bVar1 = AtomType::isFluctuatingCharge(*(AtomType **)(lVar3 + 0x78));
            if (bVar1) {
              lVar4 = (long)(this_00->super_StuntDouble).localIndex_;
              lVar3 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                        currentSnapshot_->atomData).flucQVel.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                               (this_00->super_StuntDouble).storage_);
              goto LAB_0013ba0a;
            }
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != ((uint)local_f8._M_string_length & 0x7fffffff));
    }
    if ((this_00->super_StuntDouble).objType_ == otRigidBody) {
      if (this->needPos_ == true) {
        RigidBody::updateAtoms(this_00);
      }
      if (this->needVel_ == true) {
        RigidBody::updateAtomVel(this_00);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.delim_._M_dataplus._M_p != &local_88.delim_.field_2) {
    operator_delete(local_88.delim_._M_dataplus._M_p,
                    local_88.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.tokenString_._M_dataplus._M_p != &local_88.tokenString_.field_2) {
    operator_delete(local_88.tokenString_._M_dataplus._M_p,
                    local_88.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DumpReader::parseDumpLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    int nTokens;

    nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Not enough Tokens.\n%s\n", line.c_str());
      painCave.isFatal = 1;
      simError();
    }

    int index = tokenizer.nextTokenAsInt();

    StuntDouble* sd = info_->getIOIndexToIntegrableObject(index);

    if (sd == NULL) { return; }
    std::string type = tokenizer.nextToken();
    int size         = type.size();

    size_t found;

    if (needPos_) {
      found = type.find("p");
      if (found == std::string::npos) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: StuntDouble %d has no Position\n"
                 "\tField (\"p\") specified.\n%s\n",
                 index, line.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }

    if (sd->isDirectional()) {
      if (needQuaternion_) {
        found = type.find("q");
        if (found == std::string::npos) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpReader Error: Directional StuntDouble %d has no\n"
                   "\tQuaternion Field (\"q\") specified.\n%s\n",
                   index, line.c_str());
          painCave.isFatal = 1;
          simError();
        }
      }
    }

    for (int i = 0; i < size; ++i) {
      switch (type[i]) {
      case 'p': {
        Vector3d pos;
        pos[0] = tokenizer.nextTokenAsDouble();
        pos[1] = tokenizer.nextTokenAsDouble();
        pos[2] = tokenizer.nextTokenAsDouble();
        if (needPos_) { sd->setPos(pos); }
        break;
      }
      case 'v': {
        Vector3d vel;
        vel[0] = tokenizer.nextTokenAsDouble();
        vel[1] = tokenizer.nextTokenAsDouble();
        vel[2] = tokenizer.nextTokenAsDouble();
        if (needVel_) { sd->setVel(vel); }
        break;
      }

      case 'q': {
        Quat4d q;
        if (sd->isDirectional()) {
          q[0] = tokenizer.nextTokenAsDouble();
          q[1] = tokenizer.nextTokenAsDouble();
          q[2] = tokenizer.nextTokenAsDouble();
          q[3] = tokenizer.nextTokenAsDouble();

          RealType qlen = q.length();
          if (qlen < OpenMD::epsilon) {  // check quaternion is not
            // equal to 0

            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "DumpReader Error: initial quaternion error "
                     "(q0^2 + q1^2 + q2^2 + q3^2) ~ 0\n");
            painCave.isFatal = 1;
            simError();
          }

          q.normalize();
          if (needQuaternion_) { sd->setQ(q); }
        }
        break;
      }
      case 'j': {
        Vector3d ji;
        if (sd->isDirectional()) {
          ji[0] = tokenizer.nextTokenAsDouble();
          ji[1] = tokenizer.nextTokenAsDouble();
          ji[2] = tokenizer.nextTokenAsDouble();
          if (needAngMom_) { sd->setJ(ji); }
        }
        break;
      }
      case 'f': {
        Vector3d force;
        force[0] = tokenizer.nextTokenAsDouble();
        force[1] = tokenizer.nextTokenAsDouble();
        force[2] = tokenizer.nextTokenAsDouble();
        sd->setFrc(force);
        break;
      }
      case 't': {
        Vector3d torque;
        torque[0] = tokenizer.nextTokenAsDouble();
        torque[1] = tokenizer.nextTokenAsDouble();
        torque[2] = tokenizer.nextTokenAsDouble();
        sd->setTrq(torque);
        break;
      }
      case 'u': {
        RealType particlePot;
        particlePot = tokenizer.nextTokenAsDouble();
        sd->setParticlePot(particlePot);
        break;
      }
      case 'c': {
        RealType flucQPos;
        flucQPos = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQPos(flucQPos);
        break;
      }
      case 'w': {
        RealType flucQVel;
        flucQVel = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQVel(flucQVel);
        break;
      }
      case 'g': {
        RealType flucQFrc;
        flucQFrc = tokenizer.nextTokenAsDouble();
        if (sd->isAtom())
          if (dynamic_cast<Atom*>(sd)->isFluctuatingCharge())
            sd->setFlucQFrc(flucQFrc);
        break;
      }
      case 'e': {
        Vector3d eField;
        eField[0] = tokenizer.nextTokenAsDouble();
        eField[1] = tokenizer.nextTokenAsDouble();
        eField[2] = tokenizer.nextTokenAsDouble();
        // only set the field if we have allocated memory for it
        if (readField_) sd->setElectricField(eField);
        break;
      }
      case 's': {
        RealType sPot;
        sPot = tokenizer.nextTokenAsDouble();
        sd->setSitePotential(sPot);
        break;
      }
      case 'd': {
        RealType density;
        density = tokenizer.nextTokenAsDouble();
        sd->setDensity(density);
        break;
      }

      default: {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpReader Error: %s is an unrecognized type\n",
                 type.c_str());
        painCave.isFatal = 1;
        simError();
        break;
      }
      }
    }
    if (sd->isRigidBody()) {
      RigidBody* rb = static_cast<RigidBody*>(sd);
      if (needPos_) {
        // This should let us use various atom-based selections even
        // if we have only rigid bodies:
        rb->updateAtoms();
      }
      if (needVel_) { rb->updateAtomVel(); }
    }
  }